

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

void __thiscall Units_setGetUnitId_Test::~Units_setGetUnitId_Test(Units_setGetUnitId_Test *this)

{
  Units_setGetUnitId_Test *this_local;
  
  ~Units_setGetUnitId_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Units, setGetUnitId)
{
    auto units = libcellml::Units::create();
    units->addUnit("second");
    units->addUnit("metre");

    const std::string id1 = "id1";
    const std::string id2 = "id2";
    const std::string oor = "out_of_range";

    EXPECT_TRUE(units->setUnitId(0, id1));
    EXPECT_TRUE(units->setUnitId(1, id2));
    EXPECT_FALSE(units->setUnitId(99, oor));

    EXPECT_EQ(id1, units->unitId(0));
    EXPECT_EQ(id2, units->unitId(1));
    EXPECT_EQ("", units->unitId(99));
}